

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::getRSAPrivateKey(SoftHSM *this,RSAPrivateKey *privateKey,Token *token,OSObject *key)

{
  int iVar1;
  undefined1 uVar2;
  undefined7 uVar3;
  uchar *in_R8;
  size_t in_R9;
  CK_RV CVar4;
  ByteString local_190;
  ByteString coefficient;
  ByteString exponent2;
  ByteString exponent1;
  ByteString prime2;
  ByteString prime1;
  ByteString privateExponent;
  ByteString publicExponent;
  ByteString modulus;
  
  uVar3 = (undefined7)((ulong)key >> 8);
  uVar2 = token == (Token *)0x0 || privateKey == (RSAPrivateKey *)0x0;
  if (key == (OSObject *)0x0 || (token == (Token *)0x0 || privateKey == (RSAPrivateKey *)0x0)) {
    return 7;
  }
  iVar1 = (*key->_vptr_OSObject[4])(key,2,0);
  ByteString::ByteString(&modulus);
  ByteString::ByteString(&publicExponent);
  ByteString::ByteString(&privateExponent);
  ByteString::ByteString(&prime1);
  ByteString::ByteString(&prime2);
  ByteString::ByteString(&exponent1);
  ByteString::ByteString(&exponent2);
  ByteString::ByteString(&coefficient);
  if ((char)iVar1 == '\0') {
    (*key->_vptr_OSObject[6])(&local_190,key,0x120);
    ByteString::operator=(&modulus,&local_190);
    ByteString::~ByteString(&local_190);
    (*key->_vptr_OSObject[6])(&local_190,key,0x122);
    ByteString::operator=(&publicExponent,&local_190);
    ByteString::~ByteString(&local_190);
    (*key->_vptr_OSObject[6])(&local_190,key,0x123);
    ByteString::operator=(&privateExponent,&local_190);
    ByteString::~ByteString(&local_190);
    (*key->_vptr_OSObject[6])(&local_190,key,0x124);
    ByteString::operator=(&prime1,&local_190);
    ByteString::~ByteString(&local_190);
    (*key->_vptr_OSObject[6])(&local_190,key,0x125);
    ByteString::operator=(&prime2,&local_190);
    ByteString::~ByteString(&local_190);
    (*key->_vptr_OSObject[6])(&local_190,key,0x126);
    ByteString::operator=(&exponent1,&local_190);
    ByteString::~ByteString(&local_190);
    (*key->_vptr_OSObject[6])(&local_190,key,0x127);
    ByteString::operator=(&exponent2,&local_190);
    ByteString::~ByteString(&local_190);
    (*key->_vptr_OSObject[6])(&local_190,key,0x128);
    ByteString::operator=(&coefficient,&local_190);
    ByteString::~ByteString(&local_190);
  }
  else {
    (*key->_vptr_OSObject[6])(&local_190,key,0x120);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_190,(uchar *)&modulus,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_190);
    CVar4 = 5;
    if ((char)iVar1 == '\0') goto LAB_0013390a;
    (*key->_vptr_OSObject[6])(&local_190,key,0x122);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_190,(uchar *)&publicExponent,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_190);
    if ((char)iVar1 == '\0') goto LAB_0013390a;
    (*key->_vptr_OSObject[6])(&local_190,key,0x123);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_190,(uchar *)&privateExponent,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_190);
    if ((char)iVar1 == '\0') goto LAB_0013390a;
    (*key->_vptr_OSObject[6])(&local_190,key,0x124);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_190,(uchar *)&prime1,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_190);
    if ((char)iVar1 == '\0') goto LAB_0013390a;
    (*key->_vptr_OSObject[6])(&local_190,key,0x125);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_190,(uchar *)&prime2,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_190);
    if ((char)iVar1 == '\0') goto LAB_0013390a;
    (*key->_vptr_OSObject[6])(&local_190,key,0x126);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_190,(uchar *)&exponent1,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_190);
    if ((char)iVar1 == '\0') goto LAB_0013390a;
    (*key->_vptr_OSObject[6])(&local_190,key,0x127);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_190,(uchar *)&exponent2,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_190);
    if ((char)iVar1 == '\0') goto LAB_0013390a;
    (*key->_vptr_OSObject[6])(&local_190,key,0x128);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_190,(uchar *)&coefficient,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_190);
    if ((char)iVar1 == '\0') goto LAB_0013390a;
  }
  (**(code **)(*(long *)privateKey + 0x70))(privateKey,&modulus);
  (**(code **)(*(long *)privateKey + 0x78))(privateKey,&publicExponent);
  (**(code **)(*(long *)privateKey + 0x68))(privateKey,&privateExponent);
  (**(code **)(*(long *)privateKey + 0x40))(privateKey,&prime1);
  (**(code **)(*(long *)privateKey + 0x48))(privateKey,&prime2);
  (**(code **)(*(long *)privateKey + 0x58))(privateKey,&exponent1);
  (**(code **)(*(long *)privateKey + 0x60))(privateKey,&exponent2);
  (**(code **)(*(long *)privateKey + 0x50))(privateKey,&coefficient);
  CVar4 = 0;
LAB_0013390a:
  ByteString::~ByteString(&coefficient);
  ByteString::~ByteString(&exponent2);
  ByteString::~ByteString(&exponent1);
  ByteString::~ByteString(&prime2);
  ByteString::~ByteString(&prime1);
  ByteString::~ByteString(&privateExponent);
  ByteString::~ByteString(&publicExponent);
  ByteString::~ByteString(&modulus);
  return CVar4;
}

Assistant:

CK_RV SoftHSM::getRSAPrivateKey(RSAPrivateKey* privateKey, Token* token, OSObject* key)
{
	if (privateKey == NULL) return CKR_ARGUMENTS_BAD;
	if (token == NULL) return CKR_ARGUMENTS_BAD;
	if (key == NULL) return CKR_ARGUMENTS_BAD;

	// Get the CKA_PRIVATE attribute, when the attribute is not present use default false
	bool isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, false);

	// RSA Private Key Attributes
	ByteString modulus;
	ByteString publicExponent;
	ByteString privateExponent;
	ByteString prime1;
	ByteString prime2;
	ByteString exponent1;
	ByteString exponent2;
	ByteString coefficient;
	if (isKeyPrivate)
	{
		bool bOK = true;
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_MODULUS), modulus);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PUBLIC_EXPONENT), publicExponent);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PRIVATE_EXPONENT), privateExponent);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PRIME_1), prime1);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PRIME_2), prime2);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_EXPONENT_1), exponent1);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_EXPONENT_2), exponent2);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_COEFFICIENT), coefficient);
		if (!bOK)
			return CKR_GENERAL_ERROR;
	}
	else
	{
		modulus = key->getByteStringValue(CKA_MODULUS);
		publicExponent = key->getByteStringValue(CKA_PUBLIC_EXPONENT);
		privateExponent = key->getByteStringValue(CKA_PRIVATE_EXPONENT);
		prime1 = key->getByteStringValue(CKA_PRIME_1);
		prime2 = key->getByteStringValue(CKA_PRIME_2);
		exponent1 =  key->getByteStringValue(CKA_EXPONENT_1);
		exponent2 = key->getByteStringValue(CKA_EXPONENT_2);
		coefficient = key->getByteStringValue(CKA_COEFFICIENT);
	}

	privateKey->setN(modulus);
	privateKey->setE(publicExponent);
	privateKey->setD(privateExponent);
	privateKey->setP(prime1);
	privateKey->setQ(prime2);
	privateKey->setDP1(exponent1);
	privateKey->setDQ1(exponent2);
	privateKey->setPQ(coefficient);

	return CKR_OK;
}